

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaParser::ReadEmbeddedTextures(ColladaParser *this,ZipArchiveIOSystem *zip_archive)

{
  _Base_ptr *__lhs;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_type __new_size;
  undefined8 uVar5;
  _Base_ptr p_Var6;
  string local_50;
  long *plVar4;
  
  for (p_Var6 = (this->mImageLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(this->mImageLibrary)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    if (*(_Base_ptr *)(p_Var6 + 3) == p_Var6[3]._M_parent) {
      iVar3 = (*(zip_archive->super_IOSystem)._vptr_IOSystem[4])
                        (zip_archive,*(undefined8 *)(p_Var6 + 2),"rb");
      plVar4 = (long *)CONCAT44(extraout_var,iVar3);
      if (plVar4 != (long *)0x0) {
        __new_size = (**(code **)(*plVar4 + 0x30))(plVar4);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var6 + 3),__new_size)
        ;
        uVar1 = *(undefined8 *)(p_Var6 + 3);
        uVar5 = (**(code **)(*plVar4 + 0x30))(plVar4);
        (**(code **)(*plVar4 + 0x10))(plVar4,uVar1,uVar5,1);
        BaseImporter::GetExtension(&local_50,(string *)(p_Var6 + 2));
        __lhs = &p_Var6[3]._M_right;
        std::__cxx11::string::operator=((string *)__lhs,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"jpeg");
        if (bVar2) {
          std::__cxx11::string::assign((char *)__lhs);
        }
        (**(code **)(*plVar4 + 8))(plVar4);
      }
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadEmbeddedTextures(ZipArchiveIOSystem& zip_archive)
{
    // Attempt to load any undefined Collada::Image in ImageLibrary
    for (ImageLibrary::iterator it = mImageLibrary.begin(); it != mImageLibrary.end(); ++it) {
        Collada::Image &image = (*it).second;

        if (image.mImageData.empty()) {
            std::unique_ptr<IOStream> image_file(zip_archive.Open(image.mFileName.c_str()));
            if (image_file) {
                image.mImageData.resize(image_file->FileSize());
                image_file->Read(image.mImageData.data(), image_file->FileSize(), 1);
                image.mEmbeddedFormat = BaseImporter::GetExtension(image.mFileName);
                if (image.mEmbeddedFormat == "jpeg") {
                    image.mEmbeddedFormat = "jpg";
                }
            }
        }
    }
}